

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O2

CharsMap * sentencepiece::normalizer::Builder::BuildNFKCMap(CharsMap *chars_map)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  Die local_9;
  
  iVar1 = sentencepiece::logging::GetMinLogLevel();
  if (iVar1 < 3) {
    local_9.die_ = false;
    pcVar2 = logging::BaseName("src/builder.cc");
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x167);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"LOG(");
    poVar3 = std::operator<<(poVar3,"ERROR");
    poVar3 = std::operator<<(poVar3,") ");
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"NFK compile is not enabled. rebuild with -DSPM_ENABLE_NFKC_COMPILE=ON",0x45);
    error::Die::~Die(&local_9);
  }
  sentencepiece::util::Status::Status((Status *)chars_map);
  return chars_map;
}

Assistant:

util::Status Builder::BuildNFKCMap(CharsMap *chars_map) {
#ifdef ENABLE_NFKC_COMPILE
  LOG(INFO) << "Running BuildNFKCMap";
  BuildMapInternal(chars_map, ToNFKC, ToNFKD);
#else
  LOG(ERROR) << kCompileError;
#endif

  return util::OkStatus();
}